

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optpfor.h
# Opt level: O1

string * __thiscall
FastPForLib::OPTPFor<4u,FastPForLib::Simple16<false>>::name_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  ostringstream convert;
  char local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"OPTPFor<",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  builtin_strncpy(local_1a0,"Simple16",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1a0,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string name() const {
    std::ostringstream convert;
    convert
        << "OPTPFor<" << BlockSizeInUnitsOfPackSize << ","
        << NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::ecoder.name()
        << ">";
    return convert.str();
  }